

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O2

int collectSafetyInvariantPOIndex(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  char *pcVar1;
  int i;
  
  i = 0;
  while( true ) {
    if (pNtk->vPos->nSize <= i) {
      return -1;
    }
    pObj = Abc_NtkPo(pNtk,i);
    pcVar1 = Abc_ObjName(pObj);
    pcVar1 = strstr(pcVar1,"csSafetyInvar_");
    if (pcVar1 != (char *)0x0) break;
    i = i + 1;
  }
  return i;
}

Assistant:

int collectSafetyInvariantPOIndex(Abc_Ntk_t *pNtk)
{
    Abc_Obj_t *pObj;
    int i;

    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if( strstr( Abc_ObjName( pObj ), "csSafetyInvar_" ) != NULL )
            return i;
    }        

    return -1;
}